

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O2

void * Mpm_ManFromIfLogic(Mpm_Man_t *pMan)

{
  Vec_Int_t *pVVar1;
  Mpm_Par_t *pMVar2;
  Vec_Mem_t *pVVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Mig_Obj_t *p_05;
  Mpm_Cut_t *pCut;
  Mig_Obj_t *pMVar9;
  Gia_Obj_t *pGVar10;
  int Fill;
  int Fill_00;
  int i;
  int i_00;
  long lVar11;
  Mig_Man_t *pMVar12;
  ulong uVar13;
  word *local_70;
  word uTruth;
  
  p = Vec_IntStart(pMan->pMig->nObjs);
  p_00 = Vec_IntStart(1);
  p_01 = Gia_ManStart(pMan->pMig->nObjs);
  p_02 = Vec_IntAlloc(0x10000);
  p_03 = Vec_IntAlloc(0x10);
  p_04 = Vec_IntAlloc(0x10);
  pMVar12 = pMan->pMig;
  if ((pMVar12->vCopies).pArray == (int *)0x0) {
    Vec_IntFill(&pMVar12->vCopies,pMVar12->nObjs,-1);
    pMVar12 = pMan->pMig;
  }
  pMVar12->iPage = 0;
  local_70 = &uTruth;
  iVar4 = 0;
  while (iVar4 < (pMVar12->vPages).nSize) {
    p_05 = (Mig_Obj_t *)Vec_PtrEntry(&pMVar12->vPages,iVar4);
    pMan->pMig->pPage = p_05;
    if (p_05 == (Mig_Obj_t *)0x0) break;
    for (; (uint)p_05->pFans[3] < 0xfffffffe; p_05 = p_05 + 1) {
      iVar4 = Vec_IntEntry(&pMan->vMapRefs,(uint)p_05->pFans[3] >> 1);
      if (iVar4 == 0) {
        if ((0xfffffffd < (uint)p_05->pFans[1]) && ((uint)p_05->pFans[2] < 0xfffffffe))
        goto LAB_00378275;
      }
      else {
        if ((uint)p_05->pFans[1] < 0xfffffffe) {
          p_03->nSize = 0;
          pCut = Mpm_ObjCutBestP(pMan,p_05);
          for (uVar13 = 0; uVar13 < *(uint *)&pCut->field_0x4 >> 0x1b; uVar13 = uVar13 + 1) {
            pMVar12 = pMan->pMig;
            iVar4 = Abc_Lit2Var(pCut->pLeaves[uVar13]);
            pMVar9 = Mig_ManObj(pMVar12,iVar4);
            if (pMVar9 == (Mig_Obj_t *)0x0) break;
            iVar4 = Mig_ObjCopy(pMVar9);
            Vec_IntPush(p_03,iVar4);
          }
          pMVar2 = pMan->pPars;
          if (pMVar2->fDeriveLuts == 0) {
LAB_00378548:
            i_00 = 0;
            iVar4 = Mpm_ManNodeIfToGia(p_01,pMan,p_05,p_03,0);
            iVar7 = Abc_Lit2Var(iVar4);
            iVar8 = p_00->nSize;
            Vec_IntFillExtra(p,iVar7 + 1,Fill);
            Vec_IntWriteEntry(p,iVar7,iVar8);
            Vec_IntPush(p_00,p_03->nSize);
            while (iVar8 = p_03->nSize, i_00 < iVar8) {
              iVar8 = Vec_IntEntry(p_03,i_00);
              uVar5 = Abc_Lit2Var(iVar8);
              uVar6 = Abc_Lit2Var(iVar4);
              i_00 = i_00 + 1;
              if (uVar6 <= uVar5) {
                __assert_fail("Abc_Lit2Var(Entry) < Abc_Lit2Var(iLitNew)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                              ,0x10e,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
              }
            }
            for (iVar7 = 0; iVar7 < iVar8; iVar7 = iVar7 + 1) {
              iVar8 = Vec_IntEntry(p_03,iVar7);
              iVar8 = Abc_Lit2Var(iVar8);
              Vec_IntPush(p_00,iVar8);
              iVar8 = p_03->nSize;
            }
            iVar8 = Abc_Lit2Var(iVar4);
LAB_0037863a:
            Vec_IntPush(p_00,iVar8);
          }
          else {
            if (pMVar2->fUseTruth == 0) {
              if (pMVar2->fUseDsd == 0) goto LAB_00378548;
              iVar4 = Abc_Lit2Var(*(uint *)&pCut->field_0x4 & 0x1ffffff);
              uTruth = Mpm_CutTruthFromDsd(pMan,pCut,iVar4);
            }
            else {
              uVar5 = Abc_Lit2Var(*(uint *)&pCut->field_0x4 & 0x1ffffff);
              pVVar3 = pMan->vTtMem;
              if (pVVar3->nEntries <= (int)uVar5) {
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              local_70 = pVVar3->ppPages[uVar5 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                         (long)(int)(pVVar3->PageMask & uVar5) * (long)pVVar3->nEntrySize;
            }
            iVar4 = Gia_ManFromIfLogicNode
                              ((void *)0x0,p_01,(uint)p_05->pFans[3] >> 1,p_03,p_04,local_70,
                               (char *)0x0,p_02,p,p_00,(Vec_Int_t *)0x0,0,0);
            uVar5 = *(uint *)&pCut->field_0x4;
            uVar6 = Abc_LitIsCompl(uVar5 & 0x1ffffff);
            iVar4 = Abc_LitNotCond(iVar4,uVar5 >> 0x19 & 1 ^ uVar6);
          }
        }
        else {
LAB_00378275:
          iVar4 = Mig_ObjIsCi(p_05);
          if (iVar4 == 0) {
            iVar4 = Mig_ObjIsCo(p_05);
            if (iVar4 == 0) {
              if (1 < (uint)p_05->pFans[3]) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                              ,0x120,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
              }
              iVar4 = 0;
              Vec_IntWriteEntry(p,0,p_00->nSize);
              Vec_IntPush(p_00,0);
              iVar8 = 0;
              goto LAB_0037863a;
            }
            pMVar9 = Mig_ObjFanin0(p_05);
            iVar4 = Mig_ObjCopy(pMVar9);
            iVar4 = Abc_LitNotCond(iVar4,(uint)p_05->pFans[0] & 1);
            iVar8 = Abc_Lit2Var(iVar4);
            if (p_01->nObjs <= iVar8) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
            }
            iVar8 = Abc_Lit2Var(iVar4);
            pGVar10 = Gia_ManObj(p_01,iVar8);
            if ((~*(uint *)pGVar10 & 0x1fffffff) != 0 && (int)*(uint *)pGVar10 < 0) {
              __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
            }
            pGVar10 = Gia_ManAppendObj(p_01);
            *(ulong *)pGVar10 = *(ulong *)pGVar10 | 0x80000000;
            iVar8 = Gia_ObjId(p_01,pGVar10);
            iVar7 = Abc_Lit2Var(iVar4);
            *(ulong *)pGVar10 =
                 *(ulong *)pGVar10 & 0xffffffffe0000000 | (ulong)(iVar8 - iVar7 & 0x1fffffff);
            iVar4 = Abc_LitIsCompl(iVar4);
            uVar13 = *(ulong *)pGVar10;
            *(ulong *)pGVar10 = uVar13 & 0xffffffffdfffffff | (ulong)(uint)(iVar4 << 0x1d);
            *(ulong *)pGVar10 =
                 uVar13 & 0xe0000000dfffffff | (ulong)(uint)(iVar4 << 0x1d) |
                 (ulong)(p_01->vCos->nSize & 0x1fffffff) << 0x20;
            pVVar1 = p_01->vCos;
            iVar4 = Gia_ObjId(p_01,pGVar10);
            Vec_IntPush(pVVar1,iVar4);
            if (p_01->pFanData != (int *)0x0) {
              Gia_ObjAddFanout(p_01,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),
                               pGVar10);
            }
          }
          else {
            pGVar10 = Gia_ManAppendObj(p_01);
            uVar13 = *(ulong *)pGVar10;
            *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
            *(ulong *)pGVar10 =
                 uVar13 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
            pVVar1 = p_01->vCis;
            iVar4 = Gia_ObjId(p_01,pGVar10);
            Vec_IntPush(pVVar1,iVar4);
          }
          iVar4 = Gia_ObjId(p_01,pGVar10);
          iVar4 = iVar4 * 2;
        }
        uVar5 = (uint)p_05->pFans[3] >> 1;
        lVar11 = *(long *)((long)p_05 + (-0x10 - (ulong)((uVar5 & 0xfff) << 4)));
        if (*(int *)(lVar11 + 0x9c) == 0) {
          __assert_fail("Vec_IntSize(&Mig_ObjMan(p)->vCopies) != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                        ,0xc3,"void Mig_ObjSetCopy(Mig_Obj_t *, int)");
        }
        Vec_IntWriteEntry((Vec_Int_t *)(lVar11 + 0x98),uVar5,iVar4);
      }
    }
    pMVar12 = pMan->pMig;
    iVar4 = pMVar12->iPage + 1;
    pMVar12->iPage = iVar4;
  }
  Vec_IntFree(p_02);
  Vec_IntFree(p_03);
  Vec_IntFree(p_04);
  iVar4 = p_01->nObjs;
  if (iVar4 < p->nSize) {
    p->nSize = iVar4;
  }
  else {
    Vec_IntFillExtra(p,iVar4,Fill_00);
    iVar4 = p_01->nObjs;
    if (p->nSize != iVar4) {
      __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                    ,0x12d,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
    }
  }
  for (lVar11 = 0; lVar11 < iVar4; lVar11 = lVar11 + 1) {
    iVar4 = Vec_IntEntry(p,(int)lVar11);
    if (0 < iVar4) {
      if (p->nSize <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      p->pArray[lVar11] = p->pArray[lVar11] + p_01->nObjs;
    }
    iVar4 = p->nSize;
  }
  for (iVar4 = 0; iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
    iVar8 = Vec_IntEntry(p_00,iVar4);
    Vec_IntPush(p,iVar8);
  }
  Vec_IntFree(p_00);
  if (p_01->vMapping == (Vec_Int_t *)0x0) {
    if (p_01->vPacking != (Vec_Int_t *)0x0) {
      __assert_fail("pNew->vPacking == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                    ,0x135,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
    }
    p_01->vMapping = p;
    iVar4 = 0;
    while( true ) {
      if (p_01->vCos->nSize <= iVar4) {
        return p_01;
      }
      iVar8 = Vec_IntEntry(p_01->vCos,iVar4);
      pGVar10 = Gia_ManObj(p_01,iVar8);
      if (pGVar10 == (Gia_Obj_t *)0x0) break;
      if ((~*(uint *)(pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff)) & 0x1fffffff)
          != 0 && -1 < (int)*(uint *)(pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff))
         ) {
        iVar8 = Gia_ObjId(p_01,pGVar10);
        iVar8 = Vec_IntEntry(p_01->vMapping,iVar8 - (*(uint *)pGVar10 & 0x1fffffff));
        if (iVar8 == 0) {
          __assert_fail("!Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                        ,0x13c,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
        }
      }
      iVar4 = iVar4 + 1;
    }
    return p_01;
  }
  __assert_fail("pNew->vMapping == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                ,0x134,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
}

Assistant:

void * Mpm_ManFromIfLogic( Mpm_Man_t * pMan )
{
    Gia_Man_t * pNew;
    Mpm_Cut_t * pCutBest;
    Mig_Obj_t * pObj, * pFanin;
    Vec_Int_t * vMapping, * vMapping2, * vPacking = NULL;
    Vec_Int_t * vLeaves, * vLeaves2, * vCover;
    word uTruth, * pTruth = &uTruth;
    int i, k, Entry, iLitNew;
//    assert( !pMan->pPars->fDeriveLuts || pMan->pPars->fTruth );
    // start mapping and packing
    vMapping  = Vec_IntStart( Mig_ManObjNum(pMan->pMig) );
    vMapping2 = Vec_IntStart( 1 );
    if ( 0 ) // pMan->pPars->fDeriveLuts && pMan->pPars->pLutStruct )
    {
        vPacking = Vec_IntAlloc( 1000 );
        Vec_IntPush( vPacking, 0 );
    }
    // create new manager
    pNew = Gia_ManStart( Mig_ManObjNum(pMan->pMig) );
    // iterate through nodes used in the mapping
    vCover   = Vec_IntAlloc( 1 << 16 );
    vLeaves  = Vec_IntAlloc( 16 );
    vLeaves2 = Vec_IntAlloc( 16 );
    Mig_ManCleanCopy( pMan->pMig );
    Mig_ManForEachObj( pMan->pMig, pObj )
    {
        if ( !Mpm_ObjMapRef(pMan, pObj) && !Mig_ObjIsTerm(pObj) )
            continue;
        if ( Mig_ObjIsNode(pObj) )
        {
            // collect leaves of the best cut
            Vec_IntClear( vLeaves );
            pCutBest = Mpm_ObjCutBestP( pMan, pObj );
            Mpm_CutForEachLeaf( pMan->pMig, pCutBest, pFanin, k )
                Vec_IntPush( vLeaves, Mig_ObjCopy(pFanin) );
            if ( pMan->pPars->fDeriveLuts && (pMan->pPars->fUseTruth || pMan->pPars->fUseDsd) )
            {
                extern int Gia_ManFromIfLogicNode( void * p, Gia_Man_t * pNew, int iObj, Vec_Int_t * vLeaves, Vec_Int_t * vLeavesTemp, 
                    word * pRes, char * pStr, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking, int fCheck75, int fCheck44e );
                if ( pMan->pPars->fUseTruth )
                    pTruth = Mpm_CutTruth(pMan, Abc_Lit2Var(pCutBest->iFunc));
                else
                    uTruth = Mpm_CutTruthFromDsd( pMan, pCutBest, Abc_Lit2Var(pCutBest->iFunc) );
//                Kit_DsdPrintFromTruth( pTruth, Vec_IntSize(vLeaves) );  printf( "\n" );
                // perform decomposition of the cut
                iLitNew = Gia_ManFromIfLogicNode( NULL, pNew, Mig_ObjId(pObj), vLeaves, vLeaves2, pTruth, NULL, vCover, vMapping, vMapping2, vPacking, 0, 0 );
                iLitNew = Abc_LitNotCond( iLitNew, pCutBest->fCompl ^ Abc_LitIsCompl(pCutBest->iFunc) );
            }
            else
            {
                // perform one of the two types of mapping: with and without structures
                iLitNew = Mpm_ManNodeIfToGia( pNew, pMan, pObj, vLeaves, 0 );
                // write mapping
                Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLitNew), Vec_IntSize(vMapping2) );
                Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    assert( Abc_Lit2Var(Entry) < Abc_Lit2Var(iLitNew) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    Vec_IntPush( vMapping2, Abc_Lit2Var(Entry)  );
                Vec_IntPush( vMapping2, Abc_Lit2Var(iLitNew) );
            }
        }
        else if ( Mig_ObjIsCi(pObj) )
            iLitNew = Gia_ManAppendCi(pNew);
        else if ( Mig_ObjIsCo(pObj) )
            iLitNew = Gia_ManAppendCo( pNew, Abc_LitNotCond(Mig_ObjCopy(Mig_ObjFanin0(pObj)), Mig_ObjFaninC0(pObj)) );
        else if ( Mig_ObjIsConst0(pObj) )
        {
            iLitNew = 0;
            // create const LUT
            Vec_IntWriteEntry( vMapping, 0, Vec_IntSize(vMapping2) );
            Vec_IntPush( vMapping2, 0 );
            Vec_IntPush( vMapping2, 0 );
        }
        else assert( 0 );
        Mig_ObjSetCopy( pObj, iLitNew );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vLeaves2 );
//    printf( "Mapping array size:  IfMan = %d. Gia = %d. Increase = %.2f\n", 
//        Mig_ManObjNum(pMan), Gia_ManObjNum(pNew), 1.0 * Gia_ManObjNum(pNew) / Mig_ManObjNum(pMan) );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, Entry, i )
        if ( Entry > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    assert( pNew->vPacking == NULL );
    pNew->vMapping = vMapping;
    pNew->vPacking = vPacking;
    // verify that COs have mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCo( pNew, pObj, i )
           assert( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj)) );
    }
    return pNew;
}